

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::UniformCase::writeUniformCompareExpr
          (UniformCase *this,ostringstream *dst,BasicUniform *uniform)

{
  ostream *poVar1;
  ostringstream *poVar2;
  size_t sVar3;
  size_type sVar4;
  VarValue *value;
  int iVar5;
  char *pcVar6;
  pointer pcVar7;
  bool bVar8;
  string local_38;
  
  if (uniform->type - TYPE_SAMPLER_1D < 0x1e) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&dst->super_basic_ostream<char,_std::char_traits<char>_>,"compare_vec4(",0xd);
    bVar8 = uniform->type != TYPE_SAMPLER_2D;
    pcVar6 = "textureCube";
    if (!bVar8) {
      pcVar6 = "texture2D";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (&dst->super_basic_ostream<char,_std::char_traits<char>_>,pcVar6,(ulong)bVar8 * 2 + 9)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              (&dst->super_basic_ostream<char,_std::char_traits<char>_>,"(",1);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (&dst->super_basic_ostream<char,_std::char_traits<char>_>,
                        (uniform->name)._M_dataplus._M_p,(uniform->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", vec",5);
    iVar5 = 2;
    if (uniform->type != TYPE_SAMPLER_2D) {
      iVar5 = (uint)(uniform->type == TYPE_SAMPLER_CUBE) * 3;
    }
    poVar2 = (ostringstream *)std::ostream::operator<<(poVar1,iVar5);
    pcVar7 = "(0.0))";
    sVar4 = 6;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (&dst->super_basic_ostream<char,_std::char_traits<char>_>,"compare_",8);
    pcVar6 = glu::getDataTypeName(uniform->type);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)dst +
                      (int)(dst->super_basic_ostream<char,_std::char_traits<char>_>).
                           _vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>
                (&dst->super_basic_ostream<char,_std::char_traits<char>_>,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (&dst->super_basic_ostream<char,_std::char_traits<char>_>,"(",1);
    pcVar7 = (uniform->name)._M_dataplus._M_p;
    sVar4 = (uniform->name)._M_string_length;
    poVar2 = dst;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,pcVar7,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            (&dst->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
  shaderVarValueStr_abi_cxx11_(&local_38,(Functional *)&uniform->finalValue,value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (&dst->super_basic_ostream<char,_std::char_traits<char>_>,
                      local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void UniformCase::writeUniformCompareExpr (std::ostringstream& dst, const BasicUniform& uniform) const
{
	if (glu::isDataTypeSampler(uniform.type))
	{
		dst << "compare_vec4("
			<< (uniform.type == glu::TYPE_SAMPLER_2D ? "texture2D" : "textureCube")
			<< "(" << uniform.name << ", vec" << getSamplerNumLookupDimensions(uniform.type) << "(0.0))";
	}
	else
		dst << "compare_" << glu::getDataTypeName(uniform.type) << "(" << uniform.name;

	dst << ", " << shaderVarValueStr(uniform.finalValue) << ")";
}